

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall
soplex::SPxScaler<double>::maxRowRatio(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  Real RVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  Item *pIVar6;
  long lVar7;
  double dVar8;
  double local_80;
  double local_78;
  double local_70;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_80 = 0.0;
  for (lVar4 = 0; lVar4 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar4 = lVar4 + 1) {
    pIVar6 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar4].idx;
    pdVar3 = (double *)infinity();
    local_70 = *pdVar3;
    local_78 = 0.0;
    lVar5 = 0;
    for (lVar7 = 0; lVar7 < (pIVar6->data).super_SVectorBase<double>.memused; lVar7 = lVar7 + 1) {
      dVar8 = *(double *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val + lVar5);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &(this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar1 = Tolerances::epsilon(local_40._M_ptr);
      dVar8 = ABS(dVar8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      dVar2 = local_78;
      if (RVar1 < dVar8) {
        dVar2 = dVar8;
        if (local_70 <= dVar8) {
          dVar2 = local_70;
        }
        local_70 = dVar2;
        dVar2 = dVar8;
        if (dVar8 <= local_78) {
          dVar2 = local_78;
        }
      }
      local_78 = dVar2;
      lVar5 = lVar5 + 0x10;
    }
    pdVar3 = (double *)infinity();
    if (((local_70 != *pdVar3) || (dVar8 = local_80, NAN(local_70) || NAN(*pdVar3))) &&
       (dVar8 = local_78 / local_70, local_78 / local_70 <= local_80)) {
      dVar8 = local_80;
    }
    local_80 = dVar8;
  }
  return local_80;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}